

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol.cpp
# Opt level: O0

UCollationResult
ucol_strcoll_63(UCollator *coll,UChar *source,int32_t sourceLength,UChar *target,
               int32_t targetLength)

{
  UCollationResult UVar1;
  Collator *pCVar2;
  undefined4 local_30;
  UCollationResult returnVal;
  UErrorCode status;
  int32_t targetLength_local;
  UChar *target_local;
  UChar *pUStack_18;
  int32_t sourceLength_local;
  UChar *source_local;
  UCollator *coll_local;
  
  local_30 = 0;
  returnVal = targetLength;
  _status = target;
  target_local._4_4_ = sourceLength;
  pUStack_18 = source;
  source_local = (UChar *)coll;
  pCVar2 = icu_63::Collator::fromUCollator(coll);
  UVar1 = (*(pCVar2->super_UObject)._vptr_UObject[0xb])
                    (pCVar2,pUStack_18,(ulong)target_local._4_4_,_status,(ulong)(uint)returnVal,
                     &local_30);
  return UVar1;
}

Assistant:

U_CAPI UCollationResult U_EXPORT2
ucol_strcoll( const UCollator    *coll,
              const UChar        *source,
              int32_t            sourceLength,
              const UChar        *target,
              int32_t            targetLength)
{
    UTRACE_ENTRY(UTRACE_UCOL_STRCOLL);
    if (UTRACE_LEVEL(UTRACE_VERBOSE)) {
        UTRACE_DATA3(UTRACE_VERBOSE, "coll=%p, source=%p, target=%p", coll, source, target);
        UTRACE_DATA2(UTRACE_VERBOSE, "source string = %vh ", source, sourceLength);
        UTRACE_DATA2(UTRACE_VERBOSE, "target string = %vh ", target, targetLength);
    }

    UErrorCode status = U_ZERO_ERROR;
    UCollationResult returnVal = Collator::fromUCollator(coll)->
            compare(source, sourceLength, target, targetLength, status);
    UTRACE_EXIT_VALUE_STATUS(returnVal, status);
    return returnVal;
}